

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group_collection.cpp
# Opt level: O3

void __thiscall
duckdb::CollectionCheckpointState::CollectionCheckpointState
          (CollectionCheckpointState *this,RowGroupCollection *collection,TableDataWriter *writer,
          vector<duckdb::SegmentNode<duckdb::RowGroup>,_true> *segments,
          TableStatistics *global_stats)

{
  this->collection = collection;
  this->writer = writer;
  TableDataWriter::CreateTaskExecutor((TableDataWriter *)&this->executor);
  this->segments = segments;
  (this->writers).
  super_vector<duckdb::unique_ptr<duckdb::RowGroupWriter,_std::default_delete<duckdb::RowGroupWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowGroupWriter,_std::default_delete<duckdb::RowGroupWriter>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::RowGroupWriter,_std::default_delete<duckdb::RowGroupWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowGroupWriter,_std::default_delete<duckdb::RowGroupWriter>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->writers).
  super_vector<duckdb::unique_ptr<duckdb::RowGroupWriter,_std::default_delete<duckdb::RowGroupWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowGroupWriter,_std::default_delete<duckdb::RowGroupWriter>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::RowGroupWriter,_std::default_delete<duckdb::RowGroupWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowGroupWriter,_std::default_delete<duckdb::RowGroupWriter>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->writers).
  super_vector<duckdb::unique_ptr<duckdb::RowGroupWriter,_std::default_delete<duckdb::RowGroupWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowGroupWriter,_std::default_delete<duckdb::RowGroupWriter>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::RowGroupWriter,_std::default_delete<duckdb::RowGroupWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowGroupWriter,_std::default_delete<duckdb::RowGroupWriter>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->write_data).
  super_vector<duckdb::RowGroupWriteData,_std::allocator<duckdb::RowGroupWriteData>_>.
  super__Vector_base<duckdb::RowGroupWriteData,_std::allocator<duckdb::RowGroupWriteData>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->write_data).
  super_vector<duckdb::RowGroupWriteData,_std::allocator<duckdb::RowGroupWriteData>_>.
  super__Vector_base<duckdb::RowGroupWriteData,_std::allocator<duckdb::RowGroupWriteData>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->write_data).
  super_vector<duckdb::RowGroupWriteData,_std::allocator<duckdb::RowGroupWriteData>_>.
  super__Vector_base<duckdb::RowGroupWriteData,_std::allocator<duckdb::RowGroupWriteData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->global_stats = global_stats;
  (this->write_lock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->write_lock).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->write_lock).super___mutex_base._M_mutex + 0x10) = 0;
  (this->write_lock).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->write_lock).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  ::std::
  vector<duckdb::unique_ptr<duckdb::RowGroupWriter,_std::default_delete<duckdb::RowGroupWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowGroupWriter,_std::default_delete<duckdb::RowGroupWriter>,_true>_>_>
  ::resize(&(this->writers).
            super_vector<duckdb::unique_ptr<duckdb::RowGroupWriter,_std::default_delete<duckdb::RowGroupWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowGroupWriter,_std::default_delete<duckdb::RowGroupWriter>,_true>_>_>
           ,(long)(segments->
                  super_vector<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
                  ).
                  super__Vector_base<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(segments->
                  super_vector<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
                  ).
                  super__Vector_base<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 4);
  ::std::vector<duckdb::RowGroupWriteData,_std::allocator<duckdb::RowGroupWriteData>_>::resize
            (&(this->write_data).
              super_vector<duckdb::RowGroupWriteData,_std::allocator<duckdb::RowGroupWriteData>_>,
             (long)(segments->
                   super_vector<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
                   ).
                   super__Vector_base<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(segments->
                   super_vector<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
                   ).
                   super__Vector_base<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4);
  return;
}

Assistant:

CollectionCheckpointState(RowGroupCollection &collection, TableDataWriter &writer,
	                          vector<SegmentNode<RowGroup>> &segments, TableStatistics &global_stats)
	    : collection(collection), writer(writer), executor(writer.CreateTaskExecutor()), segments(segments),
	      global_stats(global_stats) {
		writers.resize(segments.size());
		write_data.resize(segments.size());
	}